

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modern-coapp.hpp
# Opt level: O0

bytes_t * __thiscall coapp::pdu::to_bytes(bytes_t *__return_storage_ptr__,pdu *this)

{
  allocator<unsigned_char> *this_00;
  Type TVar1;
  Code CVar2;
  value_type vVar3;
  int iVar4;
  uint16_t uVar5;
  bool bVar6;
  uint8_t nibble;
  byte nibble_00;
  size_type sVar7;
  size_type sVar8;
  reference __in;
  type *ptVar9;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  byte *pbVar10;
  Code *pCVar11;
  reference pvVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  iterator __first;
  iterator __last;
  long lVar15;
  reference puVar16;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *p_Var17;
  bytes_t *this_01;
  size_type s;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> it
  ;
  uint32_t local_9c;
  anon_class_8_1_fd439fb2 local_98;
  anon_class_8_1_fd439fb2 encode_val;
  anon_class_1_0_00000001 local_85;
  uint32_t local_84;
  byte_t length_nibble;
  byte_t delta_nibble;
  anon_class_1_0_00000001 get_nibble;
  type *ptStack_80;
  uint option_delta;
  type *value;
  type *number;
  _Self local_68;
  const_iterator __end3;
  const_iterator __begin3;
  options_t *__range3;
  int prev_delta;
  undefined1 local_40 [8];
  bytes_t options_buf;
  size_type pl_size;
  int required_size;
  pdu *this_local;
  bytes_t *bytes;
  
  sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->_token);
  pl_size._4_4_ = (int)sVar7 + 4;
  options_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::size();
  if (options_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    pl_size._4_4_ =
         pl_size._4_4_ +
         (int)options_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
  }
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sVar8 = Catch::clara::std::
          multimap<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::size(&this->_options);
  if (sVar8 != 0) {
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0x400);
    __range3._0_4_ = 0;
    __end3 = Catch::clara::std::
             multimap<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::begin(&this->_options);
    local_68._M_node =
         (_Base_ptr)
         Catch::clara::std::
         multimap<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end(&this->_options);
    while (bVar6 = Catch::clara::std::operator!=(&__end3,&local_68), bVar6) {
      __in = Catch::clara::std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&__end3);
      ptVar9 = std::
               get<0ul,unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (__in);
      ptStack_80 = std::
                   get<1ul,unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             (__in);
      local_84 = *ptVar9 - (type)__range3;
      __range3._0_4_ = *ptVar9;
      nibble = to_bytes::anon_class_1_0_00000001::operator()(&local_85,&local_84);
      sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (ptStack_80);
      encode_val.options_buf._4_4_ = (undefined4)sVar7;
      nibble_00 = to_bytes::anon_class_1_0_00000001::operator()
                            (&local_85,(uint32_t *)((long)&encode_val.options_buf + 4));
      encode_val.options_buf._3_1_ = nibble << 4 | nibble_00;
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                 (value_type_conflict4 *)((long)&encode_val.options_buf + 3));
      local_98.options_buf = (bytes_t *)local_40;
      to_bytes::anon_class_8_1_fd439fb2::operator()(&local_98,nibble,&local_84);
      sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (ptStack_80);
      local_9c = (uint32_t)sVar7;
      to_bytes::anon_class_8_1_fd439fb2::operator()(&local_98,nibble_00,&local_9c);
      cVar13 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         (ptStack_80);
      cVar14 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         (ptStack_80);
      __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )cVar13._M_current,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )cVar14._M_current,__result);
      Catch::clara::std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__end3);
    }
    sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    pl_size._4_4_ = pl_size._4_4_ + (int)sVar7;
  }
  it._M_current._7_1_ = 0;
  this_00 = (allocator<unsigned_char> *)((long)&it._M_current + 6);
  Catch::clara::std::allocator<unsigned_char>::allocator(this_00);
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)pl_size._4_4_,this_00);
  Catch::clara::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&it._M_current + 6));
  iVar4._0_1_ = this->_version;
  iVar4._1_1_ = this->_type;
  iVar4._2_1_ = this->_code;
  iVar4._3_1_ = this->field_0x3;
  TVar1 = this->_type;
  this_01 = &this->_token;
  sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_01);
  pbVar10 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (__return_storage_ptr__,0);
  *pbVar10 = (byte)(iVar4 << 6) | TVar1 << 4 | (byte)sVar7;
  CVar2 = this->_code;
  pCVar11 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (__return_storage_ptr__,1);
  *pCVar11 = CVar2;
  vVar3 = *(value_type *)((long)&this->_message_id + 1);
  pvVar12 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (__return_storage_ptr__,2);
  *pvVar12 = vVar3;
  uVar5 = this->_message_id;
  pvVar12 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (__return_storage_ptr__,3);
  *pvVar12 = (value_type)uVar5;
  local_d8._M_current =
       (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (__return_storage_ptr__);
  local_d0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_d8,4);
  cVar13 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_01);
  cVar14 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_01);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar13._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar14._M_current,local_d0);
  sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->_token);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+=(&local_d0,sVar7);
  sVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (sVar7 != 0) {
    __first = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __last = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    std::
    move<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current,local_d0);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&local_d0,sVar7);
  }
  lVar15 = std::__cxx11::string::size();
  if (lVar15 != 0) {
    puVar16 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator*(&local_d0);
    *puVar16 = 0xff;
    __first_00._M_current = (char *)std::__cxx11::string::begin();
    __last_00._M_current = (char *)std::__cxx11::string::end();
    p_Var17 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator++(&local_d0);
    std::
    copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first_00,__last_00,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )p_Var17->_M_current);
  }
  it._M_current._7_1_ = 1;
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

bytes_t to_bytes() const
    {
        auto required_size = 4; // header length
        required_size += _token.size();

        if (auto pl_size = _payload.size())
            required_size += 1 /* separator */ + pl_size;

        // Encode Options
        bytes_t options_buf;
        if (_options.size()) {
            // Try to minimize allocations, options will typically fit in 1024 bytes
            // (does not increase vector size)
            options_buf.reserve(1024);

            auto prev_delta = 0;
            for (const auto& [number, value]: _options) {
                auto option_delta = number - prev_delta;
                prev_delta = number;

                auto get_nibble = [&] (const uint32_t& val) -> uint8_t {
                    if (val < 13)
                        return val;
                    if (val < 269)
                        return 13;
                    return 14;
                };

                byte_t delta_nibble = get_nibble(option_delta);
                byte_t length_nibble = get_nibble(value.size());
                options_buf.push_back((delta_nibble << 4) | length_nibble);

                auto encode_val = [&] (const byte_t nibble, const uint32_t& val) {
                    if (nibble < 13)
                        return; // already encoded in nibble

                    if (nibble == 13) {
                        options_buf.push_back(val - 13);
                    } else if (nibble == 14) {
                        auto encoded_val = val - 269;
                        assert(encoded_val <= std::numeric_limits<uint16_t>::max());
                        options_buf.push_back(encoded_val >> 8);
                        options_buf.push_back(encoded_val);
                    }
                };
                encode_val(delta_nibble, option_delta);
                encode_val(length_nibble, value.size());

                std::copy(value.begin(), value.end(),
                          std::back_inserter(options_buf));
            }

            required_size += options_buf.size();
        }

        bytes_t bytes(required_size);

        // Header
        bytes[0] = (_version << 6) | (_type << 4) | _token.size();
        bytes[1] = _code;
        bytes[2] = _message_id >> 8;
        bytes[3] = _message_id;

        // Token
        auto it = bytes.begin() + 4;
        std::copy(_token.begin(), _token.end(), it);
        it += _token.size();

        // Options
        if (auto s = options_buf.size()) {
            std::move(options_buf.begin(), options_buf.end(), it);
            it += s;
        }

        // Payload
        if (_payload.size()) {
            *it = 0xff;
            std::copy(_payload.begin(), _payload.end(), ++it);
        }

        return bytes;
    }